

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp-base64X.hpp
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
YukiWorkshop::Base64X::
Encoder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::finalize
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,Encoder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  __finalize(this,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

T finalize() {
			T ret;
			__finalize(*this, ret);
			return ret;
		}